

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.cpp
# Opt level: O0

quint64 __thiscall QRandomGenerator::_fillRange(QRandomGenerator *this,void *buffer,qptrdiff count)

{
  uint uVar1;
  SystemGenerator *begin_00;
  long in_RDX;
  SystemGenerator *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  quint32 *end;
  quint32 *begin;
  PRNGLocker lock;
  quint64 dummy;
  uint *in_stack_ffffffffffffff78;
  uint *in_stack_ffffffffffffff80;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff88;
  quint32 *in_stack_ffffffffffffffb0;
  SystemGenerator *this_00;
  undefined1 *local_20;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RSI == (SystemGenerator *)0x0) {
    in_RSI = (SystemGenerator *)&local_10;
  }
  begin_00 = in_RSI + in_RDX * 4;
  this_00 = in_RSI;
  if ((*in_RDI == 0) ||
     (uVar1 = anon_struct_1_0_00000001::loadAcquire
                        ((anon_struct_1_0_00000001 *)&qt_randomdevice_control), (uVar1 & 9) != 0)) {
    SystemGenerator::self();
    SystemGenerator::generate(this_00,(quint32 *)begin_00,in_stack_ffffffffffffffb0);
  }
  else {
    SystemAndGlobalGenerators::PRNGLocker::PRNGLocker
              ((PRNGLocker *)in_RSI,in_stack_ffffffffffffff88.this);
    std::generate<unsigned_int*,QRandomGenerator::_fillRange(void*,long_long)::__0>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff88);
    SystemAndGlobalGenerators::PRNGLocker::~PRNGLocker((PRNGLocker *)0x257ba4);
  }
  if ((long)begin_00 - (long)this_00 >> 2 == 1) {
    local_20 = (undefined1 *)(ulong)*(uint *)this_00;
  }
  else {
    local_20 = *(undefined1 **)this_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (quint64)local_20;
}

Assistant:

quint64 QRandomGenerator::_fillRange(void *buffer, qptrdiff count)
{
    // Verify that the pointers are properly aligned for 32-bit
    Q_ASSERT(quintptr(buffer) % sizeof(quint32) == 0);
    Q_ASSERT(count >= 0);
    Q_ASSERT(buffer || count <= 2);

    quint64 dummy;
    quint32 *begin = static_cast<quint32 *>(buffer ? buffer : &dummy);
    quint32 *end = begin + count;

    if (type == SystemRNG || Q_UNLIKELY(uint(qt_randomdevice_control.loadAcquire()) & (UseSystemRNG|SetRandomData))) {
        SystemGenerator::self().generate(begin, end);
    } else {
        SystemAndGlobalGenerators::PRNGLocker lock(this);
        std::generate(begin, end, [this]() { return storage.engine()(); });
    }

    if (end - begin == 1)
        return *begin;
    return begin[0] | (quint64(begin[1]) << 32);
}